

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O1

void __thiscall sf::Texture::update(Texture *this,Window *window,uint x,uint y)

{
  Uint64 UVar1;
  bool bVar2;
  Vector2u VVar3;
  Vector2u VVar4;
  TransientContextLock lock;
  TextureSaver save;
  Lock lock_1;
  
  VVar3 = Window::getSize(window);
  if ((this->m_size).x < VVar3.x + x) {
    __assert_fail("x + window.getSize().x <= m_size.x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                  ,0x23c,"void sf::Texture::update(const Window &, unsigned int, unsigned int)");
  }
  VVar3 = Window::getSize(window);
  if (VVar3.y + y <= (this->m_size).y) {
    if (this->m_texture != 0) {
      bVar2 = Window::setActive(window,true);
      if (bVar2) {
        GlResource::TransientContextLock::TransientContextLock(&lock);
        priv::TextureSaver::TextureSaver(&save);
        glBindTexture(0xde1,this->m_texture);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x247,"glBindTexture(GL_TEXTURE_2D, m_texture)");
        VVar3 = Window::getSize(window);
        VVar4 = Window::getSize(window);
        glCopyTexSubImage2D(0xde1,0,x,y,0,0,VVar3,(ulong)VVar4 >> 0x20);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x248,
                           "glCopyTexSubImage2D(GL_TEXTURE_2D, 0, x, y, 0, 0, window.getSize().x, window.getSize().y)"
                          );
        glTexParameteri(0xde1,0x2801,this->m_isSmooth | 0x2600);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x249,
                           "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST)"
                          );
        this->m_hasMipmap = false;
        this->m_pixelsFlipped = true;
        Lock::Lock(&lock_1,(Mutex *)&(anonymous_namespace)::idMutex);
        UVar1 = (anonymous_namespace)::getUniqueId()::id;
        (anonymous_namespace)::getUniqueId()::id = (anonymous_namespace)::getUniqueId()::id + 1;
        Lock::~Lock(&lock_1);
        this->m_cacheId = UVar1;
        glFlush();
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x250,"glFlush()");
        priv::TextureSaver::~TextureSaver(&save);
        GlResource::TransientContextLock::~TransientContextLock(&lock);
      }
    }
    return;
  }
  __assert_fail("y + window.getSize().y <= m_size.y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                ,0x23d,"void sf::Texture::update(const Window &, unsigned int, unsigned int)");
}

Assistant:

void Texture::update(const Window& window, unsigned int x, unsigned int y)
{
    assert(x + window.getSize().x <= m_size.x);
    assert(y + window.getSize().y <= m_size.y);

    if (m_texture && window.setActive(true))
    {
        TransientContextLock lock;

        // Make sure that the current texture binding will be preserved
        priv::TextureSaver save;

        // Copy pixels from the back-buffer to the texture
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glCopyTexSubImage2D(GL_TEXTURE_2D, 0, x, y, 0, 0, window.getSize().x, window.getSize().y));
        glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
        m_hasMipmap = false;
        m_pixelsFlipped = true;
        m_cacheId = getUniqueId();

        // Force an OpenGL flush, so that the texture will appear updated
        // in all contexts immediately (solves problems in multi-threaded apps)
        glCheck(glFlush());
    }
}